

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O0

int CfdIsFindPsbtPubkeyRecord(void *handle,void *psbt_handle,int kind,uint32_t index,char *pubkey)

{
  undefined8 uVar1;
  uint32_t in_ECX;
  int in_EDX;
  long in_RSI;
  long in_R8;
  CfdException *except;
  exception *std_except;
  NetType in_stack_0000011c;
  char *in_stack_00000120;
  int in_stack_0000012c;
  bool is_find;
  ByteData key;
  KeyData pk_obj;
  CfdCapiPsbtHandle *psbt_obj;
  int result;
  ByteData *in_stack_fffffffffffffb68;
  KeyData *in_stack_fffffffffffffb70;
  string *in_stack_fffffffffffffb80;
  string *message;
  undefined8 in_stack_fffffffffffffb88;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffb90;
  ByteData *key_00;
  undefined1 local_3c9 [33];
  CfdSourceLocation local_3a8;
  string *in_stack_fffffffffffffc78;
  pointer in_stack_fffffffffffffc80;
  ByteData local_320;
  ByteData local_308;
  Pubkey local_2f0;
  ByteData local_2d8;
  Pubkey local_2c0;
  ByteData local_2a8;
  Pubkey local_290;
  ByteData local_278;
  bool local_259;
  ByteData local_258;
  KeyData local_240;
  undefined1 local_ea;
  allocator local_e9;
  string local_e8 [32];
  CfdSourceLocation local_c8;
  undefined1 local_aa;
  allocator local_a9;
  string local_a8 [32];
  CfdSourceLocation local_88;
  long local_70;
  allocator local_61;
  string local_60 [52];
  undefined4 local_2c;
  long local_28;
  uint32_t local_20;
  int local_1c;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffb88 >> 0x20);
  local_2c = 0xffffffff;
  local_28 = in_R8;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"PsbtHandle",&local_61);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_70 = local_18;
  if (local_28 == 0) {
    local_88.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_88.filename = local_88.filename + 1;
    local_88.line = 0x642;
    local_88.funcname = "CfdIsFindPsbtPubkeyRecord";
    cfd::core::logger::warn<>(&local_88,"pubkey is null.");
    local_aa = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"Failed to parameter. pubkey is null.",&local_a9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffb90,error_code,in_stack_fffffffffffffb80);
    local_aa = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)(local_18 + 0x18) != 0) {
    cfd::capi::ParsePubkey(in_stack_0000012c,in_stack_00000120,in_stack_0000011c);
    cfd::core::ByteData::ByteData(&local_258);
    local_259 = true;
    switch(local_1c) {
    case 1:
      cfd::core::KeyData::GetPubkey(&local_290,&local_240);
      cfd::core::Psbt::CreatePubkeyRecordKey(&local_278,'\x02',&local_290);
      cfd::core::ByteData::operator=
                ((ByteData *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
      cfd::core::ByteData::~ByteData((ByteData *)0x5f819e);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x5f81ab);
      local_259 = cfd::core::Psbt::IsFindTxInRecord(*(Psbt **)(local_70 + 0x18),local_20,&local_258)
      ;
      break;
    case 2:
      cfd::core::KeyData::GetPubkey(&local_2c0,&local_240);
      cfd::core::Psbt::CreatePubkeyRecordKey(&local_2a8,'\x06',&local_2c0);
      cfd::core::ByteData::operator=
                ((ByteData *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
      cfd::core::ByteData::~ByteData((ByteData *)0x5f827b);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x5f8288);
      local_259 = cfd::core::Psbt::IsFindTxInRecord(*(Psbt **)(local_70 + 0x18),local_20,&local_258)
      ;
      break;
    case 3:
      cfd::core::KeyData::GetPubkey(&local_2f0,&local_240);
      cfd::core::Psbt::CreatePubkeyRecordKey(&local_2d8,'\x02',&local_2f0);
      cfd::core::ByteData::operator=
                ((ByteData *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
      cfd::core::ByteData::~ByteData((ByteData *)0x5f833f);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x5f834c);
      local_259 = cfd::core::Psbt::IsFindTxOutRecord
                            (*(Psbt **)(local_70 + 0x18),local_20,&local_258);
      break;
    case 4:
      cfd::core::KeyData::GetExtPubkey((ExtPubkey *)&stack0xfffffffffffffc70,&local_240);
      cfd::core::ExtPubkey::GetData(&local_320,(ExtPubkey *)&stack0xfffffffffffffc70);
      cfd::core::Psbt::CreateFixRecordKey(&local_308,'\x01',&local_320);
      key_00 = &local_258;
      cfd::core::ByteData::operator=
                ((ByteData *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
      cfd::core::ByteData::~ByteData((ByteData *)0x5f841a);
      cfd::core::ByteData::~ByteData((ByteData *)0x5f8427);
      cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffffb70);
      local_259 = cfd::core::Psbt::IsFindGlobalRecord(*(Psbt **)(local_70 + 0x18),key_00);
      break;
    default:
      local_3a8.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                   ,0x2f);
      local_3a8.filename = local_3a8.filename + 1;
      local_3a8.line = 0x667;
      local_3a8.funcname = "CfdIsFindPsbtPubkeyRecord";
      cfd::core::logger::warn<int&>(&local_3a8,"kind is invalid: {}",&local_1c);
      uVar1 = __cxa_allocate_exception(0x30);
      message = (string *)local_3c9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_3c9 + 1),"Failed to parameter. kind is invalid.",
                 (allocator *)message);
      cfd::core::CfdException::CfdException(in_stack_fffffffffffffb90,error_code,message);
      __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    if (local_259 == false) {
      local_4 = 8;
    }
    else {
      local_4 = 0;
    }
    cfd::core::ByteData::~ByteData((ByteData *)0x5f8622);
    cfd::core::KeyData::~KeyData(in_stack_fffffffffffffb70);
    return local_4;
  }
  local_c8.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
               ,0x2f);
  local_c8.filename = local_c8.filename + 1;
  local_c8.line = 0x648;
  local_c8.funcname = "CfdIsFindPsbtPubkeyRecord";
  cfd::core::logger::warn<>(&local_c8,"psbt is null.");
  local_ea = 1;
  uVar1 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"Failed to handle statement. psbt is null.",&local_e9);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffb90,error_code,in_stack_fffffffffffffb80);
  local_ea = 0;
  __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdIsFindPsbtPubkeyRecord(
    void* handle, void* psbt_handle, int kind, uint32_t index,
    const char* pubkey) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (pubkey == nullptr) {
      warn(CFD_LOG_SOURCE, "pubkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    KeyData pk_obj = ParsePubkey(kind, pubkey, psbt_obj->net_type);
    ByteData key;
    bool is_find = true;
    switch (kind) {
      case kCfdPsbtRecordInputSignature:
        key = Psbt::CreatePubkeyRecordKey(
            Psbt::kPsbtInputPartialSig, pk_obj.GetPubkey());
        is_find = psbt_obj->psbt->IsFindTxInRecord(index, key);
        break;
      case kCfdPsbtRecordInputBip32:
        key = Psbt::CreatePubkeyRecordKey(
            Psbt::kPsbtInputBip32Derivation, pk_obj.GetPubkey());
        is_find = psbt_obj->psbt->IsFindTxInRecord(index, key);
        break;
      case kCfdPsbtRecordOutputBip32:
        key = Psbt::CreatePubkeyRecordKey(
            Psbt::kPsbtOutputBip32Derivation, pk_obj.GetPubkey());
        is_find = psbt_obj->psbt->IsFindTxOutRecord(index, key);
        break;
      case kCfdPsbtRecordGloalXpub:
        key = Psbt::CreateFixRecordKey(
            Psbt::kPsbtGlobalXpub, pk_obj.GetExtPubkey().GetData());
        is_find = psbt_obj->psbt->IsFindGlobalRecord(key);
        break;
      default:
        warn(CFD_LOG_SOURCE, "kind is invalid: {}", kind);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. kind is invalid.");
    }

    if (!is_find) return CfdErrorCode::kCfdNotFoundError;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}